

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

uint stb_hash2(char *str,uint *hash2_ptr)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0x77f044ed;
  uVar3 = 0x3141592c;
  for (; cVar1 = *str, cVar1 != '\0'; str = str + 1) {
    uVar3 = (uVar3 << 7 | uVar3 >> 0x19) + (int)cVar1;
    uVar2 = (uVar2 << 0xb | uVar2 >> 0x15) + (int)cVar1;
  }
  *hash2_ptr = (uVar3 >> 0x10) + uVar2;
  return (uVar2 >> 0x10) + uVar3;
}

Assistant:

unsigned int stb_hash2(char *str, unsigned int *hash2_ptr)
{
   unsigned int hash1 = 0x3141592c;
   unsigned int hash2 = 0x77f044ed;
   while (*str) {
      hash1 = (hash1 << 7) + (hash1 >> 25) + *str;
      hash2 = (hash2 << 11) + (hash2 >> 21) + *str;
      ++str;
   }
   *hash2_ptr = hash2 + (hash1 >> 16);
   return       hash1 + (hash2 >> 16);
}